

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUpdateRight(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *vec,int *ridx,int n,
                   number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  uint *puVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  long lVar18;
  byte bVar19;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [13];
  undefined3 uStack_28b;
  int iStack_288;
  bool bStack_284;
  undefined8 local_280;
  int *local_278;
  pointer local_270;
  int *local_268;
  int *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  long local_250;
  int *local_248;
  long local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  undefined8 local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  fpclass_type local_140;
  int32_t iStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [13];
  undefined3 uStack_cb;
  int iStack_c8;
  bool bStack_c4;
  undefined8 local_c0;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar19 = 0;
  local_1b8._0_16_ = (undefined1  [16])0x0;
  local_1b8._16_16_ = (undefined1  [16])0x0;
  local_198 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = SUB1613((undefined1  [16])0x0,0);
  uStack_14b = 0;
  local_1c0._0_4_ = cpp_dec_float_finite;
  local_1c0._4_4_ = 0x1c;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1cb = 0;
  iStack_1c8 = 0;
  bStack_1c4 = false;
  iVar2 = (this->l).firstUnused;
  iVar7 = (this->l).firstUpdate;
  lVar18 = (long)iVar7;
  if (iVar7 < iVar2) {
    local_270 = (this->l).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_278 = (this->l).idx;
    local_260 = (this->l).row;
    local_268 = (this->l).start;
    local_258 = eps;
    local_248 = ridx;
    do {
      iVar7 = local_260[lVar18];
      pnVar12 = vec + iVar7;
      puVar15 = (uint *)local_1b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar15 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      iVar8 = vec[iVar7].m_backend.exp;
      bVar1 = vec[iVar7].m_backend.neg;
      fVar3 = vec[iVar7].m_backend.fpclass;
      iVar4 = vec[iVar7].m_backend.prec_elem;
      iStack_13c = iVar4;
      local_140 = fVar3;
      pnVar12 = vec + iVar7;
      puVar15 = (uint *)local_2f8;
      iStack_148 = iVar8;
      bStack_144 = bVar1;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar15 = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
      }
      pnVar12 = local_258;
      pcVar16 = &local_b0;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar16->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        pcVar16 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar16 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_b0.exp = (local_258->m_backend).exp;
      local_b0.neg = (local_258->m_backend).neg;
      local_b0.fpclass = (local_258->m_backend).fpclass;
      local_b0.prec_elem = (local_258->m_backend).prec_elem;
      local_280._4_4_ = iVar4;
      local_280._0_4_ = fVar3;
      bStack_284 = bVar1;
      if ((bVar1 == true) && (local_2f8._0_4_ != 0 || fVar3 != cpp_dec_float_finite)) {
        bStack_284 = false;
      }
      local_250 = lVar18;
      if ((local_b0.fpclass != cpp_dec_float_NaN && fVar3 != cpp_dec_float_NaN) &&
         (iStack_288 = iVar8,
         iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_2f8,&local_b0), 0 < iVar7)) {
        lVar10 = (long)local_268[lVar18];
        iVar7 = local_268[lVar18 + 1];
        if (local_268[lVar18] < iVar7) {
          pcVar16 = &local_270[lVar10].m_backend;
          piVar11 = local_278 + lVar10;
          local_240 = lVar10;
          do {
            iVar8 = *piVar11;
            local_248[n] = iVar8;
            pnVar12 = vec + iVar8;
            pnVar13 = pnVar12;
            puVar15 = (uint *)local_238;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar15 = (pnVar13->m_backend).data._M_elems[0];
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
            }
            iStack_1c8 = vec[iVar8].m_backend.exp;
            bStack_1c4 = vec[iVar8].m_backend.neg;
            fVar5 = vec[iVar8].m_backend.fpclass;
            iVar6 = vec[iVar8].m_backend.prec_elem;
            local_1c0._0_4_ = fVar5;
            local_1c0._4_4_ = iVar6;
            uVar9 = 0;
            if (fVar5 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_2f8,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_238,
                                 (cpp_dec_float<200U,_int,_void> *)local_2f8);
              uVar9 = (uint)(iVar8 == 0);
            }
            local_c0._0_4_ = cpp_dec_float_finite;
            local_c0._4_4_ = 0x1c;
            local_138 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_118 = (undefined1  [16])0x0;
            local_108 = (undefined1  [16])0x0;
            local_f8 = (undefined1  [16])0x0;
            local_e8 = (undefined1  [16])0x0;
            local_d8 = SUB1613((undefined1  [16])0x0,0);
            uStack_cb = 0;
            iStack_c8 = 0;
            bStack_c4 = false;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
            if (pcVar16 != (cpp_dec_float<200U,_int,_void> *)local_138) {
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_138;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4)
                ;
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4)
                ;
              }
              iStack_c8 = iStack_148;
              bStack_c4 = bStack_144;
              local_c0._0_4_ = local_140;
              local_c0._4_4_ = iStack_13c;
              pcVar14 = pcVar16;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_138,pcVar14);
            local_280._0_4_ = cpp_dec_float_finite;
            local_280._4_4_ = 0x1c;
            iStack_288 = 0;
            bStack_284 = false;
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_238;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4);
            }
            iStack_288 = iStack_1c8;
            bStack_284 = bStack_1c4;
            local_280._0_4_ = (fpclass_type)local_1c0;
            local_280._4_4_ = local_1c0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                       (cpp_dec_float<200U,_int,_void> *)local_138);
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_2f8;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_238;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar19 * -8 + 4);
            }
            iStack_1c8 = iStack_288;
            bStack_1c4 = bStack_284;
            local_1c0._0_4_ = (fpclass_type)local_280;
            local_1c0._4_4_ = local_280._4_4_;
            if ((fpclass_type)local_280 == cpp_dec_float_NaN) {
LAB_0053f6b5:
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_238;
              puVar15 = (uint *)local_2f8;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                *puVar15 = (pcVar14->data)._M_elems[0];
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar19 * -8 + 4)
                ;
                puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
              }
              iStack_288 = iStack_1c8;
              bStack_284 = bStack_1c4;
              local_280._0_4_ = (fpclass_type)local_1c0;
              local_280._4_4_ = local_1c0._4_4_;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_2f8,0,(type *)0x0);
              iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_238,
                                 (cpp_dec_float<200U,_int,_void> *)local_2f8);
              if (iVar8 != 0) goto LAB_0053f6b5;
              local_280._0_4_ = cpp_dec_float_finite;
              local_280._4_4_ = 0x1c;
              local_2f8._0_16_ = (undefined1  [16])0x0;
              local_2f8._16_16_ = (undefined1  [16])0x0;
              local_2d8 = (undefined1  [16])0x0;
              local_2c8 = (undefined1  [16])0x0;
              local_2b8 = (undefined1  [16])0x0;
              local_2a8 = (undefined1  [16])0x0;
              local_298 = SUB1613((undefined1  [16])0x0,0);
              uStack_28b = 0;
              iStack_288 = 0;
              bStack_284 = false;
              boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                        ((cpp_dec_float<200u,int,void> *)local_2f8,1e-100);
            }
            piVar11 = piVar11 + 1;
            n = n + uVar9;
            pcVar16 = pcVar16 + 1;
            puVar15 = (uint *)local_2f8;
            pnVar13 = pnVar12;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pnVar13->m_backend).data._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
              pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar13 + ((ulong)bVar19 * -2 + 1) * 4);
            }
            (pnVar12->m_backend).exp = iStack_288;
            (pnVar12->m_backend).neg = bStack_284;
            (pnVar12->m_backend).fpclass = (fpclass_type)local_280;
            (pnVar12->m_backend).prec_elem = local_280._4_4_;
            iVar7 = iVar7 + -1;
          } while ((int)local_240 < iVar7);
        }
      }
      lVar18 = local_250 + 1;
    } while (iVar2 != (int)lVar18);
  }
  return n;
}

Assistant:

int CLUFactor<R>::vSolveUpdateRight(R* vec, int* ridx, int n, R eps)
{
   int i, j, k;
   int end;
   R x, y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      assert(i >= 0 && i < thedim);
      x = vec[lrow[i]];

      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            int m = ridx[n] = *idx++;
            assert(m >= 0 && m < thedim);
            y = vec[m];
            n += (y == 0) ? 1 : 0;
            y = y - x * (*val++);
            vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
         }
      }
   }

   return n;
}